

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_math.c
# Opt level: O2

_Bool math_min(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  undefined6 in_register_00000012;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar1;
  bool bVar2;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 *paVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  gravity_float_t gVar8;
  gravity_value_t value;
  gravity_class_t *pgVar3;
  
  if ((int)CONCAT62(in_register_00000012,nargs) != 1) {
    paVar4 = &args[1].field_1;
    dVar7 = 1.79769313486232e+308;
    uVar6 = 1;
    bVar2 = false;
    for (uVar5 = 1; uVar5 < nargs; uVar5 = uVar5 + 1) {
      gVar8 = paVar4->f;
      if (((gravity_value_t *)(paVar4 + -1))->isa == gravity_class_int) {
        gVar8 = (gravity_float_t)(long)gVar8;
LAB_001339fa:
        bVar2 = true;
        if (gVar8 < dVar7) {
          uVar6 = uVar5 & 0xffffffff;
          dVar7 = gVar8;
        }
      }
      else if (((gravity_value_t *)(paVar4 + -1))->isa == gravity_class_float) goto LAB_001339fa;
      paVar4 = paVar4 + 2;
    }
    if (bVar2) {
      uVar5 = (ulong)(((uint)uVar6 & 0xffff) << 4);
      aVar1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
              ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)&args->field_1 + uVar5))->n;
      pgVar3 = *(gravity_class_t **)((long)&args->isa + uVar5);
      goto LAB_00133a3e;
    }
  }
  aVar1.n = 0;
  pgVar3 = gravity_class_null;
LAB_00133a3e:
  value.field_1.n = aVar1.n;
  value.isa = pgVar3;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool math_min (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs == 1) RETURN_VALUE(VALUE_FROM_NULL, rindex);

    gravity_float_t n = GRAVITY_FLOAT_MAX;
    uint16_t minindex = 1;
    bool found = false;

    for (uint16_t i = 1; i<nargs; ++i) {
        gravity_value_t value = GET_VALUE(i);
        if (VALUE_ISA_INT(value)) {
            found = true;
            if ((gravity_float_t)value.n < n) {
                n = (gravity_float_t)value.n;
                minindex = i;
            }
        } else if (VALUE_ISA_FLOAT(value)) {
            found = true;
            if (value.f < n) {
                n = value.f;
                minindex = i;
            }
        } else continue;
    }

    if (!found) {
        RETURN_VALUE(VALUE_FROM_NULL, rindex);
    }

    RETURN_VALUE(GET_VALUE(minindex), rindex);
}